

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_reseterror(HSQUIRRELVM v)

{
  SQObjectPtr::Null(&v->_lasterror);
  return;
}

Assistant:

void sq_reseterror(HSQUIRRELVM v)
{
    v->_lasterror.Null();
}